

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::CompletePolymorphicInlining
          (Inline *this,Instr *callInstr,RegOpnd *returnValueOpnd,LabelInstr *doneLabel,
          Instr *dispatchStartLabel,Instr *ldMethodFldInstr,BailOutKind bailoutKind)

{
  undefined2 valueType;
  _func_int **pp_Var1;
  Func *pFVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  StackSym *pSVar8;
  undefined4 *puVar9;
  Instr *this_00;
  Opnd *pOVar10;
  ByteCodeUsesInstr *this_01;
  Instr *pIVar11;
  IntConstOpnd *this_02;
  RegOpnd *this_03;
  uint uVar12;
  Instr *pIVar13;
  int iVar14;
  
  branchTarget = IR::LabelInstr::New(Label,callInstr->m_func,true);
  IR::Instr::InsertBefore(callInstr,&branchTarget->super_Instr);
  instr = IR::BranchInstr::New(Br,branchTarget,callInstr->m_func);
  IR::Instr::InsertBefore(dispatchStartLabel,&instr->super_Instr);
  if (ldMethodFldInstr != (Instr *)0x0) {
    IR::Instr::InsertBefore(callInstr,ldMethodFldInstr);
  }
  instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (BailOnNotPolymorphicInlinee,bailoutKind,callInstr,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,&instr_00->super_Instr);
  pSVar8 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar11 = (pSVar8->field_5).m_instrDef;
  if ((pIVar11 != (Instr *)0x0 & pSVar8->field_0x18) == 1) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) goto LAB_00546eec;
    *puVar9 = 0;
    pIVar11 = (pSVar8->field_5).m_instrDef;
  }
  iVar14 = 0;
  do {
    if (pIVar11->m_src2 == (Opnd *)0x0) {
LAB_00546b60:
      pIVar13 = (Instr *)0x0;
    }
    else {
      OVar4 = IR::Opnd::GetKind(pIVar11->m_src2);
      if (OVar4 != OpndKindSym) goto LAB_00546b60;
      pOVar10 = pIVar11->m_src2;
      OVar4 = IR::Opnd::GetKind(pOVar10);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_00546eec;
        *puVar9 = 0;
      }
      pp_Var1 = pOVar10[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_00546eec;
        *puVar9 = 0;
      }
      uVar7 = *(uint *)(pp_Var1 + 3);
      uVar12 = uVar7 & 0x100000;
      if ((uVar12 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_00546eec;
        *puVar9 = 0;
        uVar7 = *(uint *)(pp_Var1 + 3);
        uVar12 = uVar7 & 0x100000;
      }
      if (uVar12 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_00546eec;
        *puVar9 = 0;
        uVar7 = *(uint *)(pp_Var1 + 3);
      }
      if (((uVar7 & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) {
        bVar5 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase);
        if (!bVar5) {
          bVar5 = Func::IsInPhase(callInstr->m_func,FGBuildPhase);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar5) goto LAB_00546eec;
            *puVar9 = 0;
          }
        }
      }
      if (((ulong)pp_Var1[3] & 1) == 0) goto LAB_00546b60;
      pIVar13 = (Instr *)pp_Var1[5];
    }
    if (pIVar11->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar11->m_opcode == StartCall) {
        if (pIVar13 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar5) goto LAB_00546eec;
          *puVar9 = 0;
        }
        break;
      }
      this_00 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func);
      IR::Instr::SetByteCodeOffset(this_00,callInstr);
      pOVar10 = pIVar11->m_src1;
      if (this_00->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_00546eec;
        *puVar9 = 0;
      }
      pFVar2 = this_00->m_func;
      if (pOVar10->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) goto LAB_00546eec;
        *puVar9 = 0;
      }
      bVar6 = pOVar10->field_0xb;
      if ((bVar6 & 2) != 0) {
        pOVar10 = IR::Opnd::Copy(pOVar10,pFVar2);
        bVar6 = pOVar10->field_0xb;
      }
      pOVar10->field_0xb = bVar6 | 2;
      this_00->m_src1 = pOVar10;
      IR::Instr::InsertBefore(callInstr,this_00);
      iVar14 = iVar14 + 1;
      IR::Instr::Remove(pIVar11);
    }
    pIVar11 = pIVar13;
  } while (pIVar13 != (Instr *)0x0);
  this_01 = IR::ByteCodeUsesInstr::New(callInstr);
  IR::ByteCodeUsesInstr::Set(this_01,callInstr->m_src1);
  IR::Instr::InsertBefore(callInstr,&this_01->super_Instr);
  pIVar11 = IR::Instr::New(EndCallForPolymorphicInlinee,callInstr->m_func);
  this_02 = IR::IntConstOpnd::New((ulong)(iVar14 + 3),TyInt32,callInstr->m_func,true);
  if (pIVar11->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_00546eec;
    *puVar9 = 0;
  }
  pFVar2 = pIVar11->m_func;
  if ((this_02->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_00546eec;
    *puVar9 = 0;
  }
  bVar6 = (this_02->super_Opnd).field_0xb;
  if ((bVar6 & 2) != 0) {
    this_02 = (IntConstOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,pFVar2);
    bVar6 = (this_02->super_Opnd).field_0xb;
  }
  (this_02->super_Opnd).field_0xb = bVar6 | 2;
  pIVar11->m_src1 = &this_02->super_Opnd;
  if (returnValueOpnd != (RegOpnd *)0x0) {
    pSVar8 = returnValueOpnd->m_sym;
    if ((pSVar8->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar5) {
LAB_00546eec:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    this_03 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,callInstr->m_func);
    valueType = (returnValueOpnd->super_Opnd).m_valueType;
    IR::Opnd::SetValueType(&this_03->super_Opnd,(ValueType)valueType);
    IR::Instr::SetDst(pIVar11,&this_03->super_Opnd);
  }
  IR::Instr::InsertBefore(callInstr,pIVar11);
  IR::Instr::InsertBefore(callInstr,&doneLabel->super_Instr);
  IR::Instr::Remove(callInstr);
  return;
}

Assistant:

void Inline::CompletePolymorphicInlining(IR::Instr* callInstr, IR::RegOpnd* returnValueOpnd, IR::LabelInstr* doneLabel, IR::Instr* dispatchStartLabel, IR::Instr* ldMethodFldInstr, IR::BailOutKind bailoutKind)
{
    // Label $bailout:
    // LdMethodFldPolyInlineMiss
    // BailOnNotPolymorphicInlinee $callOutBytecodeOffset - BailOutOnFailedPolymorphicInlineTypeCheck
    // ByteCoudeUses
    // BytecodeArgoutUses
    // returnValueOpnd = EndCallForPolymorphicInlinee actualsCount
    IR::LabelInstr* bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, /*helperLabel*/ true);
    callInstr->InsertBefore(bailOutLabel);
    dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::Br, bailOutLabel, callInstr->m_func));

    // Only fixed function inlining requires a ldMethodFldInstr
    if (ldMethodFldInstr)
    {
        callInstr->InsertBefore(ldMethodFldInstr);
    }

    callInstr->InsertBefore(IR::BailOutInstr::New(Js::OpCode::BailOnNotPolymorphicInlinee, bailoutKind, callInstr, callInstr->m_func));

    uint actualsCount = 0;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        IR::Instr* bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
        bytecodeArgOutUse->SetByteCodeOffset(callInstr);
        bytecodeArgOutUse->SetSrc1(argInstr->GetSrc1());
        callInstr->InsertBefore(bytecodeArgOutUse);
        actualsCount++;
        // Remove the original args
        argInstr->Remove();
        return false;
    });
    IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
    bytecodeUses->Set(callInstr->GetSrc1());
    callInstr->InsertBefore(bytecodeUses);

    IR::Instr* endCallInstr = IR::Instr::New(Js::OpCode::EndCallForPolymorphicInlinee, callInstr->m_func);
    endCallInstr->SetSrc1(IR::IntConstOpnd::New(actualsCount + Js::Constants::InlineeMetaArgCount, TyInt32, callInstr->m_func, /*dontEncode*/ true));
    if (returnValueOpnd)
    {
        StackSym* returnValueSym = returnValueOpnd->m_sym->AsStackSym();
        IR::Opnd* dstOpnd = IR::RegOpnd::New(returnValueSym, returnValueSym->GetType(), callInstr->m_func);
        dstOpnd->SetValueType(returnValueOpnd->GetValueType());
        endCallInstr->SetDst(dstOpnd);
    }
    callInstr->InsertBefore(endCallInstr);
    callInstr->InsertBefore(doneLabel);
    callInstr->Remove(); // We don't need callInstr anymore.
}